

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

void __thiscall ON_Mesh::SetSolidOrientation(ON_Mesh *this,int solid_orientation)

{
  int solid_orientation_local;
  ON_Mesh *this_local;
  
  if (solid_orientation == -1) {
    SetClosed(this,1);
    this->m_mesh_is_manifold = '\x01';
    this->m_mesh_is_oriented = '\x01';
    this->m_mesh_is_solid = '\x02';
  }
  else if (solid_orientation == 0) {
    this->m_mesh_is_solid = '\x03';
  }
  else if (solid_orientation == 1) {
    SetClosed(this,1);
    this->m_mesh_is_manifold = '\x01';
    this->m_mesh_is_oriented = '\x01';
    this->m_mesh_is_solid = '\x01';
  }
  else {
    this->m_mesh_is_solid = '\0';
  }
  return;
}

Assistant:

void ON_Mesh::SetSolidOrientation(int solid_orientation)
{
  switch(solid_orientation)
  {
  case -1: // closed oriented manifold solid with inward face normals
    SetClosed(1);
    m_mesh_is_manifold = 1;
    m_mesh_is_oriented = 1;
    m_mesh_is_solid = 2;
    break;

  case  0: // not solid
    m_mesh_is_solid = 3;
    // DO NOT SET m_mesh_is_closed here.
    // Meshes can be closed but not solid
    break;

  case  1: // closed oriented manifold solid with outward face normals
    SetClosed(1);
    m_mesh_is_manifold = 1;
    m_mesh_is_oriented = 1;
    m_mesh_is_solid = 1;
    break;

  default:
    m_mesh_is_solid = 0;
    break;
  }
}